

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall
Fl_Text_Display::clear_rect(Fl_Text_Display *this,int style,int X,int Y,int width,int height)

{
  int iVar1;
  Fl_Color FVar2;
  Fl_Color color2;
  float weight;
  
  if (width == 0) {
    return;
  }
  if (((uint)style >> 10 & 1) == 0) {
    if (((uint)style >> 0xb & 1) == 0) {
      FVar2 = (this->super_Fl_Group).super_Fl_Widget.color_;
      goto LAB_001d035c;
    }
    FVar2 = (this->super_Fl_Group).super_Fl_Widget.color_;
    color2 = (this->super_Fl_Group).super_Fl_Widget.color2_;
    if ((Fl_Text_Display *)Fl::focus_ == this) {
      weight = 0.5;
    }
    else {
      weight = 0.6;
    }
  }
  else {
    if ((Fl_Text_Display *)Fl::focus_ == this) {
      FVar2 = (this->super_Fl_Group).super_Fl_Widget.color2_;
      goto LAB_001d035c;
    }
    FVar2 = (this->super_Fl_Group).super_Fl_Widget.color_;
    color2 = (this->super_Fl_Group).super_Fl_Widget.color2_;
    weight = 0.4;
  }
  FVar2 = fl_color_average(FVar2,color2,weight);
LAB_001d035c:
  iVar1 = Fl_Widget::active_r((Fl_Widget *)this);
  if (iVar1 == 0) {
    FVar2 = fl_inactive(FVar2);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)Y,width,(ulong)(uint)height);
  return;
}

Assistant:

void Fl_Text_Display::clear_rect(int style,
                                 int X, int Y,
                                 int width, int height) const {
  /* A width of zero means "clear to end of window" to XClearArea */
  if ( width == 0 )
    return;

  Fl_Color c;
  if (style & PRIMARY_MASK) {
    if (Fl::focus()==(Fl_Widget*)this) {
      c = selection_color();
    } else {
      c = fl_color_average(color(), selection_color(), 0.4f);
    }
  } else if (style & HIGHLIGHT_MASK) {
    if (Fl::focus()==(Fl_Widget*)this) {
      c = fl_color_average(color(), selection_color(), 0.5f);
    } else {
      c = fl_color_average(color(), selection_color(), 0.6f);
    }
  } else {
    c = color();
  }
  fl_color(active_r() ? c : fl_inactive(c));
  fl_rectf( X, Y, width, height );
}